

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O2

void sym_insert(BuildCtx *ctx,int32_t ofs,char *prefix,char *suffix)

{
  undefined8 *puVar1;
  BuildSym *pBVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  undefined8 *puVar6;
  long lVar7;
  
  lVar4 = (long)ctx->nsym;
  ctx->nsym = ctx->nsym + 1;
  for (lVar7 = lVar4 << 4;
      (pBVar2 = ctx->sym, 0 < lVar4 && (ofs < *(int *)((long)pBVar2 + lVar7 + -8)));
      lVar7 = lVar7 + -0x10) {
    puVar1 = (undefined8 *)((long)&pBVar2[-1].name + lVar7);
    uVar3 = puVar1[1];
    puVar6 = (undefined8 *)((long)&pBVar2->name + lVar7);
    *puVar6 = *puVar1;
    puVar6[1] = uVar3;
    lVar4 = lVar4 + -1;
  }
  *(int32_t *)((long)&pBVar2->ofs + lVar7) = ofs;
  pcVar5 = sym_decorate(ctx,prefix,suffix);
  *(char **)((long)&ctx->sym->name + lVar7) = pcVar5;
  return;
}

Assistant:

static void sym_insert(BuildCtx *ctx, int32_t ofs,
		       const char *prefix, const char *suffix)
{
  ptrdiff_t i = ctx->nsym++;
  while (i > 0) {
    if (ctx->sym[i-1].ofs <= ofs)
      break;
    ctx->sym[i] = ctx->sym[i-1];
    i--;
  }
  ctx->sym[i].ofs = ofs;
  ctx->sym[i].name = sym_decorate(ctx, prefix, suffix);
}